

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

DatatypeValidator * __thiscall
xercesc_4_0::TraverseSchema::getDatatypeValidator
          (TraverseSchema *this,XMLCh *uriStr,XMLCh *localPartStr)

{
  XMLBuffer *this_00;
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  int iVar5;
  XMLCh *pXVar6;
  XMLSize_t XVar7;
  Grammar *pGVar8;
  DatatypeValidator *pDVar9;
  XMLCh *pXVar10;
  long lVar11;
  DatatypeValidatorFactory *this_01;
  
  if (uriStr == L"http://www.w3.org/2001/XMLSchema") {
LAB_00331f32:
    this_01 = this->fDatatypeRegistry;
    goto LAB_00332016;
  }
  pXVar6 = L"http://www.w3.org/2001/XMLSchema";
  pXVar10 = uriStr;
  if (uriStr == (XMLCh *)0x0) {
LAB_00331f03:
    if (*pXVar6 == L'\0') goto LAB_00331f32;
  }
  else {
    do {
      XVar3 = *pXVar10;
      if (XVar3 == L'\0') goto LAB_00331f03;
      XVar4 = *pXVar6;
      pXVar6 = pXVar6 + 1;
      pXVar10 = pXVar10 + 1;
    } while (XVar3 == XVar4);
  }
  this_00 = &this->fBuffer;
  (this->fBuffer).fIndex = 0;
  if ((uriStr == (XMLCh *)0x0) || (*uriStr == L'\0')) {
    XVar7 = 0;
  }
  else {
    XMLBuffer::append(this_00,uriStr);
    XVar7 = this_00->fIndex;
  }
  if (XVar7 == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
    XVar7 = this_00->fIndex;
  }
  (this->fBuffer).fIndex = XVar7 + 1;
  (this->fBuffer).fBuffer[XVar7] = L',';
  XMLBuffer::append(this_00,localPartStr);
  if ((uriStr == (XMLCh *)0x0) || (pXVar6 = this->fTargetNSURIString, pXVar6 == uriStr)) {
LAB_00332001:
    localPartStr = (this->fBuffer).fBuffer;
    this_01 = this->fDatatypeRegistry;
    localPartStr[(this->fBuffer).fIndex] = L'\0';
  }
  else {
    if (pXVar6 == (XMLCh *)0x0) {
      XVar3 = *uriStr;
joined_r0x00331fae:
      if (XVar3 == L'\0') goto LAB_00332001;
    }
    else {
      lVar11 = 0;
      do {
        psVar1 = (short *)((long)uriStr + lVar11);
        if (*psVar1 == 0) {
          XVar3 = *(XMLCh *)((long)pXVar6 + lVar11);
          goto joined_r0x00331fae;
        }
        psVar2 = (short *)((long)pXVar6 + lVar11);
        lVar11 = lVar11 + 2;
      } while (*psVar1 == *psVar2);
    }
    pGVar8 = GrammarResolver::getGrammar(this->fGrammarResolver,uriStr);
    if ((pGVar8 == (Grammar *)0x0) ||
       (iVar5 = (*(pGVar8->super_XSerializable)._vptr_XSerializable[5])(pGVar8), iVar5 != 1)) {
      return (DatatypeValidator *)0x0;
    }
    this_01 = (DatatypeValidatorFactory *)(pGVar8 + 0xf);
    localPartStr = (this->fBuffer).fBuffer;
    localPartStr[(this->fBuffer).fIndex] = L'\0';
  }
LAB_00332016:
  pDVar9 = DatatypeValidatorFactory::getDatatypeValidator(this_01,localPartStr);
  return pDVar9;
}

Assistant:

DatatypeValidator*
TraverseSchema::getDatatypeValidator(const XMLCh* const uriStr,
                                     const XMLCh* const localPartStr) {

    DatatypeValidator* dv = 0;

    if (XMLString::equals(uriStr, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {
        dv = fDatatypeRegistry->getDatatypeValidator(localPartStr);
    }
    else {

        fBuffer.set(uriStr);
        fBuffer.append(chComma);
        fBuffer.append(localPartStr);

        if ((uriStr) && !XMLString::equals(uriStr, fTargetNSURIString)) {

            Grammar* grammar = fGrammarResolver->getGrammar(uriStr);

            if (grammar && grammar->getGrammarType() == Grammar::SchemaGrammarType) {
                dv = ((SchemaGrammar*) grammar)->getDatatypeRegistry()->getDatatypeValidator(fBuffer.getRawBuffer());
            }
        }
        else {
            dv = fDatatypeRegistry->getDatatypeValidator(fBuffer.getRawBuffer());
        }
    }

    return dv;
}